

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::GetMDObjectByType
          (PacketList *this,byte_t *ObjectID,InterchangeObject **Object)

{
  char cVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  long *plVar2;
  undefined1 *puVar3;
  
  if (CONCAT71(in_register_00000009,in_CL) == 0 || Object == (InterchangeObject **)0x0) {
    puVar3 = Kumu::RESULT_PTR;
  }
  else {
    *(undefined8 *)CONCAT71(in_register_00000009,in_CL) = 0;
    puVar3 = Kumu::RESULT_FAIL;
    plVar2 = (long *)ObjectID;
    do {
      plVar2 = (long *)*plVar2;
      if (plVar2 == (long *)ObjectID) goto LAB_001a3d33;
      cVar1 = (**(code **)(*(long *)plVar2[2] + 0x20))((long *)plVar2[2],Object);
    } while (cVar1 == '\0');
    *(undefined8 *)CONCAT71(in_register_00000009,in_CL) = plVar2[2];
    puVar3 = (undefined1 *)&Kumu::RESULT_OK;
  }
LAB_001a3d33:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::GetMDObjectByType(const byte_t* ObjectID, InterchangeObject** Object)
{
  ASDCP_TEST_NULL(ObjectID);
  ASDCP_TEST_NULL(Object);
  std::list<InterchangeObject*>::iterator li;
  *Object = 0;

  for ( li = m_List.begin(); li != m_List.end(); li++ )
    {
      if ( (*li)->HasUL(ObjectID) )
	{
	  *Object = *li;
	  return RESULT_OK;
	}
    }

  return RESULT_FAIL;
}